

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O3

void __thiscall OpenMD::HBondJump::findHBonds(HBondJump *this,int frame)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  HBondDonor *pHVar4;
  Atom *pAVar5;
  _func_int **pp_Var6;
  long lVar7;
  Atom *pAVar8;
  bool bVar9;
  Molecule *pMVar10;
  long lVar11;
  pointer ppAVar12;
  long lVar13;
  long lVar14;
  pointer ppHVar15;
  MoleculeIterator mj;
  MoleculeIterator mi;
  MoleculeIterator local_170;
  MoleculeIterator local_168;
  pointer local_160;
  Molecule *local_158;
  long local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_128;
  double dStack_120;
  double local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  Vector3d local_e8;
  Vector3d local_c8;
  Vector3d local_a8;
  Vector3d local_88;
  Vector3d local_68;
  Vector3d local_48;
  
  local_168._M_node = (_Base_ptr)0x0;
  local_170._M_node = (_Base_ptr)0x0;
  pMVar10 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_168);
  if (pMVar10 != (Molecule *)0x0) {
    do {
      ppHVar15 = (pMVar10->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppHVar15 !=
          (pMVar10->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pHVar4 = *ppHVar15;
        while (pHVar4 != (HBondDonor *)0x0) {
          ppHVar15 = ppHVar15 + 1;
          (*(this->super_TimeCorrFunc<double>).super_DynamicProperty._vptr_DynamicProperty[0x14])
                    (this,(ulong)(uint)frame,
                     (ulong)(uint)(pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_);
          if (ppHVar15 ==
              (pMVar10->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) break;
          pHVar4 = *ppHVar15;
        }
      }
      pMVar10 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_168);
    } while (pMVar10 != (Molecule *)0x0);
  }
  local_158 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_168);
  if (local_158 != (Molecule *)0x0) {
    local_150 = (long)frame * 3;
    do {
      ppAVar12 = (pointer)(local_158->hBondDonors_).
                          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
      if (ppAVar12 !=
          (pointer)(local_158->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pAVar5 = *ppAVar12;
          if (pAVar5 == (Atom *)0x0) break;
          pp_Var6 = (pAVar5->super_StuntDouble)._vptr_StuntDouble;
          iVar2 = *(int *)(*(long *)&(pAVar5->super_StuntDouble).objType_ + 0x28);
          iVar3 = (&(((this->GIDtoH_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start)[local_150][iVar2];
          local_f8 = *(double *)
                      (*(long *)(pp_Var6[2] + *(long *)(pp_Var6[3] + 0x18)) + 0x10 +
                      (long)*(int *)(pp_Var6 + 6) * 0x18);
          pdVar1 = (double *)
                   (*(long *)(pp_Var6[2] + *(long *)(pp_Var6[3] + 0x18)) +
                   (long)*(int *)(pp_Var6 + 6) * 0x18);
          local_108 = *pdVar1;
          dStack_100 = pdVar1[1];
          lVar7 = *(long *)&(pAVar5->super_StuntDouble).objType_;
          lVar14 = *(long *)(*(long *)(*(long *)(lVar7 + 0x18) + 0x18) + *(long *)(lVar7 + 0x10));
          local_118 = *(double *)(lVar14 + 0x10 + (long)*(int *)(lVar7 + 0x30) * 0x18);
          pdVar1 = (double *)(lVar14 + (long)*(int *)(lVar7 + 0x30) * 0x18);
          local_128 = *pdVar1;
          dStack_120 = pdVar1[1];
          local_170._M_node = local_168._M_node;
          local_160 = ppAVar12;
          pMVar10 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_170);
          while (pMVar10 != (Molecule *)0x0) {
            ppAVar12 = (pMVar10->hBondAcceptors_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (ppAVar12 !=
                (pMVar10->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pAVar5 = *ppAVar12;
              while (pAVar5 != (Atom *)0x0) {
                ppAVar12 = ppAVar12 + 1;
                lVar14 = (long)(pAVar5->super_StuntDouble).localIndex_;
                lVar7 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->
                                          currentSnapshot_->atomData).position.
                                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                 (pAVar5->super_StuntDouble).storage_);
                local_138 = *(double *)(lVar7 + 0x10 + lVar14 * 0x18);
                pdVar1 = (double *)(lVar7 + lVar14 * 0x18);
                local_148 = *pdVar1;
                dStack_140 = pdVar1[1];
                pdVar1 = (double *)(lVar7 + lVar14 * 0x18);
                local_88.super_Vector<double,_3U>.data_[0] = *pdVar1;
                local_88.super_Vector<double,_3U>.data_[1] = pdVar1[1];
                local_88.super_Vector<double,_3U>.data_[2] =
                     *(double *)(lVar7 + 0x10 + lVar14 * 0x18);
                local_68.super_Vector<double,_3U>.data_[0] = local_128;
                local_68.super_Vector<double,_3U>.data_[1] = dStack_120;
                local_68.super_Vector<double,_3U>.data_[2] = local_118;
                local_48.super_Vector<double,_3U>.data_[0] = local_108;
                local_48.super_Vector<double,_3U>.data_[1] = dStack_100;
                local_48.super_Vector<double,_3U>.data_[2] = local_f8;
                bVar9 = isHBond(this,&local_48,&local_68,&local_88);
                if (bVar9) {
                  registerHydrogenBond
                            (this,frame,iVar3,iVar2,(pAVar5->super_StuntDouble).globalIndex_);
                }
                if (ppAVar12 ==
                    (pMVar10->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) break;
                pAVar5 = *ppAVar12;
              }
            }
            pMVar10 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_170);
          }
          ppAVar12 = local_160 + 1;
        } while (ppAVar12 !=
                 (pointer)(local_158->hBondDonors_).
                          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      ppAVar12 = (local_158->hBondAcceptors_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      while ((ppAVar12 !=
              (local_158->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish && (pAVar5 = *ppAVar12, pAVar5 != (Atom *)0x0))) {
        lVar14 = (long)(pAVar5->super_StuntDouble).localIndex_;
        lVar7 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                         (pAVar5->super_StuntDouble).storage_);
        local_138 = *(double *)(lVar7 + 0x10 + lVar14 * 0x18);
        pdVar1 = (double *)(lVar7 + lVar14 * 0x18);
        local_148 = *pdVar1;
        dStack_140 = pdVar1[1];
        local_170._M_node = local_168._M_node;
        local_160 = ppAVar12;
        pMVar10 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_170);
        while (pMVar10 != (Molecule *)0x0) {
          ppHVar15 = (pMVar10->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppHVar15 !=
              (pMVar10->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pHVar4 = *ppHVar15;
            while (pHVar4 != (HBondDonor *)0x0) {
              ppHVar15 = ppHVar15 + 1;
              pAVar8 = pHVar4->donorAtom;
              iVar2 = (pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_;
              iVar3 = (&(((this->GIDtoH_).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[local_150][iVar2];
              lVar13 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar7 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                       ->atomData).position.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                               (pAVar8->super_StuntDouble).storage_);
              local_f8 = *(double *)(lVar7 + 0x10 + lVar13 * 0x18);
              pdVar1 = (double *)(lVar7 + lVar13 * 0x18);
              local_108 = *pdVar1;
              dStack_100 = pdVar1[1];
              pAVar8 = pHVar4->donatedHydrogen;
              lVar11 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar14 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar8->super_StuntDouble).storage_);
              local_118 = *(double *)(lVar14 + 0x10 + lVar11 * 0x18);
              pdVar1 = (double *)(lVar14 + lVar11 * 0x18);
              local_128 = *pdVar1;
              dStack_120 = pdVar1[1];
              local_a8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar7 + 0x10 + lVar13 * 0x18)
              ;
              pdVar1 = (double *)(lVar7 + lVar13 * 0x18);
              local_a8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_a8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar14 + 0x10 + lVar11 * 0x18);
              pdVar1 = (double *)(lVar14 + lVar11 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              local_e8.super_Vector<double,_3U>.data_[0] = local_148;
              local_e8.super_Vector<double,_3U>.data_[1] = dStack_140;
              local_e8.super_Vector<double,_3U>.data_[2] = local_138;
              bVar9 = isHBond(this,&local_a8,&local_c8,&local_e8);
              if (bVar9) {
                registerHydrogenBond
                          (this,frame,iVar3,iVar2,(pAVar5->super_StuntDouble).globalIndex_);
              }
              if (ppHVar15 ==
                  (pMVar10->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
              pHVar4 = *ppHVar15;
            }
          }
          pMVar10 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_170);
        }
        ppAVar12 = local_160 + 1;
      }
      local_158 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_168);
    } while (local_158 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void HBondJump::findHBonds(int frame) {
    Molecule* mol1;
    Molecule* mol2;
    SimInfo::MoleculeIterator mi, mj;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos, hPos, aPos;
    int hInd, index, aInd;

    // Register all the possible HBond donor hydrogens:
    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = registerHydrogen(frame, hInd);
      }
    }

    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];

        dPos = hbd->donorAtom->getPos();
        hPos = hbd->donatedHydrogen->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aPos = hba->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd = hbd->donatedHydrogen->getGlobalIndex();
            // no need to register, just look up the index:
            index = GIDtoH_[frame][hInd];

            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
            }
          }
        }
      }
    }
  }